

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void dialer_reap(void *arg)

{
  nni_sock *s_00;
  int iVar1;
  nni_pipe *local_28;
  nni_pipe *p;
  nni_sock *s;
  nni_dialer *d;
  void *arg_local;
  
  s_00 = *(nni_sock **)((long)arg + 0x80);
  nni_stat_unregister((nni_stat_item *)((long)arg + 0x550));
  nni_mtx_lock(&s_00->s_mx);
  iVar1 = nni_list_empty((nni_list *)((long)arg + 0xc0));
  if (iVar1 == 0) {
    for (local_28 = (nni_pipe *)nni_list_first((nni_list *)((long)arg + 0xc0));
        local_28 != (nni_pipe *)0x0;
        local_28 = (nni_pipe *)nni_list_next((nni_list *)((long)arg + 0xc0),local_28)) {
      nni_pipe_close(local_28);
    }
    nni_mtx_unlock(&s_00->s_mx);
    nni_dialer_reap((nni_dialer *)arg);
  }
  else {
    nni_mtx_unlock(&s_00->s_mx);
    nni_sock_rele(s_00);
    nni_dialer_destroy((nni_dialer *)arg);
  }
  return;
}

Assistant:

static void
dialer_reap(void *arg)
{
	nni_dialer *d = arg;
	nni_sock   *s = d->d_sock;

#ifdef NNG_ENABLE_STATS
	nni_stat_unregister(&d->st_root);
#endif

	nni_mtx_lock(&s->s_mx);
	if (!nni_list_empty(&d->d_pipes)) {
		nni_pipe *p;
		// This should already have been done, but be certain!
		NNI_LIST_FOREACH (&d->d_pipes, p) {
			nni_pipe_close(p);
		}
		nni_mtx_unlock(&s->s_mx);
		// Go back to the end of reap list.
		nni_dialer_reap(d);
		return;
	}

	nni_mtx_unlock(&s->s_mx);

	nni_sock_rele(s);

	nni_dialer_destroy(d);
}